

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O1

double __thiscall Tank::findVolume(Tank *this,double aHead)

{
  double dVar1;
  double dVar2;
  double local_38;
  double slope;
  double intercept;
  
  dVar2 = aHead - (this->super_Node).elev;
  if (this->volCurve == (Curve *)0x0) {
    if ((0.0 < this->minVolume) && (dVar1 = aHead - this->minHead, dVar2 = 0.0, 0.0 <= dVar1)) {
      dVar2 = dVar1;
    }
    dVar2 = dVar2 * this->area + this->minVolume;
  }
  else {
    intercept = dVar2 * this->ucfLength;
    Curve::findSegment(this->volCurve,intercept,&local_38,&slope);
    dVar2 = this->ucfLength;
    dVar2 = (intercept * local_38 + slope) / (dVar2 * dVar2 * dVar2);
  }
  return dVar2;
}

Assistant:

double Tank::findVolume(double aHead)
{
    // ... convert head to water depth

    double depth = aHead - elev;

    // ... tank has a volume curve (in original user units)

    if ( volCurve )
    {
        // ... find slope and intercept of curve segment containing depth

        depth *= ucfLength;
        double slope, intercept;
        volCurve->findSegment(depth, slope, intercept);

        // ... compute volume and convert to ft3

        double ucfArea = ucfLength * ucfLength;
        return (slope * depth + intercept) / (ucfArea * ucfLength);
    }

    // ... tank is cylindrical

    if ( minVolume > 0.0 ) depth = max(aHead - minHead, 0.0);
    return minVolume + area * depth;
}